

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyProcFormat(ProcConsumer xConsumer,void *pData,char *zFormat,...)

{
  char in_AL;
  sxi32 sVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_38 [4];
  sxi32 rc;
  va_list ap;
  char *zFormat_local;
  void *pData_local;
  ProcConsumer xConsumer_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  rc = 0x30;
  local_38 = (undefined1  [4])0x18;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  ap[0].reg_save_area = zFormat;
  sVar1 = FormatMount(1,(void *)0x0,xConsumer,pData,(sxu32 *)0x0,zFormat,(__va_list_tag *)local_38);
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyProcFormat(ProcConsumer xConsumer, void *pData, const char *zFormat, ...)
{
	va_list ap;
	sxi32 rc;
#if defined(UNTRUST)	
	if( SX_EMPTY_STR(zFormat) ){
		return SXERR_EMPTY;
	}
#endif
	va_start(ap, zFormat);
	rc = FormatMount(SXFMT_CONS_PROC, 0, xConsumer, pData, 0, zFormat, ap);
	va_end(ap);
	return rc;
}